

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool parse_vrplib_edge_weight_section(VrplibParser *p,Instance *instance)

{
  uint uVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  char *lexeme;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint node_id;
  uint uVar8;
  int iVar9;
  bool bVar10;
  double value;
  double local_48;
  ulong local_40;
  Instance *local_38;
  
  if (p->edgew_format == EDGE_WEIGHT_FORMAT_EXPLICIT) {
    if (instance->edge_weight == (double *)0x0) {
      __assert_fail("instance->edge_weight",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                    ,0x261,"_Bool parse_vrplib_edge_weight_section(VrplibParser *, Instance *)");
    }
    uVar1 = instance->num_customers;
    local_40 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      _Var3 = true;
    }
    else {
      _Var3 = true;
      uVar5 = 0;
      local_38 = instance;
      do {
        uVar6 = uVar5 + 1;
        uVar8 = uVar6;
        if ((int)uVar5 < (int)local_40) {
          do {
            if (uVar5 == uVar8) {
              __assert_fail("i != j",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                            ,0x2c,"int64_t sxpos(int32_t, int32_t, int32_t)");
            }
            uVar4 = uVar8;
            if ((int)uVar5 < (int)uVar8) {
              uVar4 = uVar5;
            }
            uVar7 = uVar8;
            if ((int)uVar8 < (int)uVar5) {
              uVar7 = uVar5;
            }
            iVar9 = 3;
            do {
              lexeme = get_token_lexeme(p);
              if (iVar9 == 1) {
                local_48 = 0.0;
                _Var2 = str_to_double(lexeme,&local_48);
                if (_Var2) {
                  local_38->edge_weight
                  [(int)((uVar4 * (uVar1 + 1) + uVar7) - ((uVar4 + 2) * (uVar4 + 1) >> 1))] =
                       local_48;
                }
                else {
                  _Var3 = false;
                  parse_error(p,"Expected valid double for reduced cost");
                }
              }
              else {
                node_id = uVar8;
                if (iVar9 == 3) {
                  node_id = uVar5;
                }
                _Var3 = parse_node_id(p,lexeme,node_id);
              }
              if (lexeme != (char *)0x0) {
                free(lexeme);
              }
              if (_Var3 == false) {
                return false;
              }
              iVar9 = iVar9 + -1;
            } while (iVar9 != 0);
            _Var2 = parser_match_newline(p);
            if (!_Var2) {
              parse_error(p,"Expected newline after reduced cost for arc `(%d, %d)``",(ulong)uVar6);
              return false;
            }
            bVar10 = uVar8 != (uint)local_40;
            uVar8 = uVar8 + 1;
          } while (bVar10);
        }
        bVar10 = uVar5 != (uint)local_40;
        uVar5 = uVar6;
      } while (bVar10);
    }
  }
  else {
    _Var3 = false;
    parse_error(p,
                "Found un-expected `EDGE_WEIGHT_SECTION`. EDGE_WEIGHT_TYPE should be set accordingly"
               );
  }
  return _Var3;
}

Assistant:

static bool parse_vrplib_edge_weight_section(VrplibParser *p,
                                             Instance *instance) {
    bool result = true;
    int32_t n = instance->num_customers + 1;

    bool needs_edge_section = parser_needs_edge_section(p);
    if (!needs_edge_section) {
        parse_error(p, "Found un-expected `EDGE_WEIGHT_SECTION`. "
                       "EDGE_WEIGHT_TYPE should be set accordingly");
        return false;
    }

    assert(instance->edge_weight);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = i + 1; j < n; j++) {
            int32_t idx = sxpos(n, i, j);

            for (int32_t lexid = 0; lexid < 3; lexid++) {
                char *lexeme = get_token_lexeme(p);
                if (lexid == 0 || lexid == 1) {
                    result = parse_node_id(p, lexeme, lexid == 0 ? i : j);
                } else {
                    // Parse the reduced cost variable
                    double value = 0;
                    if (!str_to_double(lexeme, &value)) {
                        parse_error(p,
                                    "Expected valid double for reduced cost");
                        result = false;
                    } else {
                        instance->edge_weight[idx] = value;
                    }
                }

                if (lexeme) {
                    free(lexeme);
                }

                if (!result) {
                    goto terminate;
                }
            }

            if (!parser_match_newline(p)) {
                parse_error(p,
                            "Expected newline after reduced cost for arc "
                            "`(%d, %d)``",
                            i + 1, j + 1);
                result = false;
                goto terminate;
            }
        }
    }

terminate:
    return result;
}